

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Gudhi::zigzag_persistence::Zigzag_matrix_options<(Gudhi::persistence_matrix::Column_types)4>_>_>
::remove_maximal_cell
          (Chain_matrix<Gudhi::persistence_matrix::Matrix<Gudhi::zigzag_persistence::Zigzag_matrix_options<(Gudhi::persistence_matrix::Column_types)4>_>_>
           *this,ID_index cellID,vector<unsigned_int,_std::allocator<unsigned_int>_> *columnsToSwap)

{
  bool bVar1;
  mapped_type *pmVar2;
  reference puVar3;
  uint local_44;
  const_iterator cStack_40;
  ID_index i;
  const_iterator __end0;
  const_iterator __begin0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  Index startIndex;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *columnsToSwap_local;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Gudhi::zigzag_persistence::Zigzag_matrix_options<(Gudhi::persistence_matrix::Column_types)4>_>_>
  *pCStack_10;
  ID_index cellID_local;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Gudhi::zigzag_persistence::Zigzag_matrix_options<(Gudhi::persistence_matrix::Column_types)4>_>_>
  *this_local;
  
  columnsToSwap_local._4_4_ = cellID;
  pCStack_10 = this;
  pmVar2 = std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::at(&this->pivotToColumnIndex_,(key_type *)((long)&columnsToSwap_local + 4));
  __range2._4_4_ = *pmVar2;
  __end0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(columnsToSwap);
  cStack_40 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(columnsToSwap);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end0,&stack0xffffffffffffffc0);
    if (!bVar1) break;
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end0);
    local_44 = *puVar3;
    pmVar2 = std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::at(&this->pivotToColumnIndex_,&local_44);
    __range2._4_4_ =
         Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Gudhi::zigzag_persistence::Zigzag_matrix_options<(Gudhi::persistence_matrix::Column_types)4>_>_>
         ::vine_swap(&this->super_Chain_vine_swap_option,__range2._4_4_,*pmVar2);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end0);
  }
  _remove_last(this,__range2._4_4_);
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::remove_maximal_cell(ID_index cellID,
                                                             const std::vector<ID_index>& columnsToSwap)
{
  static_assert(Master_matrix::Option_list::has_removable_columns,
                "'remove_maximal_cell' is not implemented for the chosen options.");
  static_assert(Master_matrix::Option_list::has_map_column_container && Master_matrix::Option_list::has_vine_update,
                "'remove_maximal_cell' is not implemented for the chosen options.");

  // TODO: find simple test to verify that col at columnIndex is maximal even without row access.

  Index startIndex = pivotToColumnIndex_.at(cellID);

  for (ID_index i : columnsToSwap) {
    startIndex = Swap_opt::vine_swap(startIndex, pivotToColumnIndex_.at(i));
  }

  _remove_last(startIndex);
}